

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(NearestNeighborsIndex *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NearestNeighborsIndex_00393ee0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->floatsamples_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_) {
    protobuf_NearestNeighbors_2eproto::InitDefaults();
  }
  this->numberofdimensions_ = 0;
  this->_oneof_case_[1] = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

NearestNeighborsIndex::NearestNeighborsIndex()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NearestNeighbors_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NearestNeighborsIndex)
}